

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

void __thiscall VulkanHppGenerator::generateExtensionInspectionFile(VulkanHppGenerator *this)

{
  pointer pEVar1;
  pointer pFVar2;
  __type_conflict _Var3;
  bool bVar4;
  pointer pEVar5;
  long lVar6;
  VulkanHppGenerator *pVVar7;
  char *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  string *psVar10;
  pointer __rhs;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  string previousLeave;
  string previousLeave_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  string previousEnter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  allocator<char> local_92d;
  allocator<char> local_92c;
  allocator<char> local_92b;
  allocator<char> local_92a;
  allocator<char> local_929;
  allocator<char> local_928;
  allocator<char> local_927;
  allocator<char> local_926;
  allocator<char> local_925;
  allocator<char> local_924;
  allocator<char> local_923;
  allocator<char> local_922;
  allocator<char> local_921;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a0;
  string promotedExtensions;
  string obsoletedExtensions;
  string deprecatedExtensions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  string versions;
  string promotedTo;
  string obsoletedBy;
  string deprecatedBy;
  string vulkan_extension_inspection_hpp;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string str;
  string vulkanExtensionInspectionHppTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_460;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_420;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&previousLeave,
             "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp",
             (allocator<char> *)&previousLeave_6);
  std::operator+(&previousEnter,&previousLeave,"/vulkan/");
  std::operator+(&local_4e0.first,&previousEnter,&this->m_api);
  std::operator+(&vulkan_extension_inspection_hpp,&local_4e0.first,"_extension_inspection.hpp");
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&previousEnter);
  std::__cxx11::string::~string((string *)&previousLeave);
  std::operator+(&previousEnter,"VulkanHppGenerator: Generating ",&vulkan_extension_inspection_hpp);
  std::operator+(&local_4e0.first,&previousEnter," ...\n");
  SyncedMessageHandler::message(&messager,&local_4e0.first);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::__cxx11::string::~string((string *)&previousEnter);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e0,"ExtensionInspection.hpp",(allocator<char> *)&previousEnter);
  anon_unknown.dwarf_dd40c::readSnippet(&vulkanExtensionInspectionHppTemplate,&local_4e0.first);
  std::__cxx11::string::~string((string *)&local_4e0);
  deprecatedExtensions._M_dataplus._M_p = (pointer)&deprecatedExtensions.field_2;
  deprecatedExtensions._M_string_length = 0;
  previousEnter._M_dataplus._M_p = (pointer)&previousEnter.field_2;
  previousEnter._M_string_length = 0;
  previousLeave._M_dataplus._M_p = (pointer)&previousLeave.field_2;
  previousLeave._M_string_length = 0;
  deprecatedExtensions.field_2._M_local_buf[0] = '\0';
  previousEnter.field_2._M_local_buf[0] = '\0';
  previousLeave.field_2._M_local_buf[0] = '\0';
  pEVar5 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar10 = &((this->m_extensions).
              super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
              ._M_impl.super__Vector_impl_data._M_start)->name;
  while( true ) {
    pEVar1 = (pointer)((long)&psVar10[-2].field_2 + 8);
    if (pEVar1 == pEVar5) break;
    if (psVar10[-1].field_2._M_local_buf[8] == '\x01') {
      pVVar7 = this;
      getProtectFromTitle(&previousLeave_6,this,psVar10);
      generateProtection(&local_4e0,pVVar7,&previousLeave_6,true);
      std::__cxx11::string::~string((string *)&previousLeave_6);
      _Var3 = std::operator==(&previousEnter,&local_4e0.first);
      if (_Var3) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"\n",&local_929);
      }
      else {
        std::operator+(&local_5c0,"\n",&previousLeave);
        std::operator+(&local_8a0,&local_5c0,&local_4e0.first);
      }
      std::operator+(&local_900,&local_8a0,"{ \"");
      std::operator+(&local_8e0,&local_900,psVar10);
      std::operator+(&local_920,&local_8e0,"\", \"");
      std::__cxx11::string::string
                ((string *)&local_8c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pEVar1);
      std::operator+(&local_990,&local_920,&local_8c0);
      std::operator+(&previousLeave_6,&local_990,"\"}, ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&deprecatedExtensions,&previousLeave_6);
      std::__cxx11::string::~string((string *)&previousLeave_6);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::~string((string *)&local_900);
      std::__cxx11::string::~string((string *)&local_8a0);
      if (!_Var3) {
        std::__cxx11::string::~string((string *)&local_5c0);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousEnter,&local_4e0.first);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousLeave,&local_4e0.second);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_4e0);
    }
    psVar10 = (string *)((long)&psVar10[0xc].field_2 + 8);
  }
  if (deprecatedExtensions._M_string_length != 0) {
    bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            ends_with(&deprecatedExtensions,", ");
    if (!bVar4) {
      pcVar8 = 
      "std::string VulkanHppGenerator::generateReplacedExtensionsList(Predicate, Extraction) const [Predicate = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:172:76), Extraction = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:173:76)]"
      ;
      goto LAB_0010d6cf;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_4e0.first,&deprecatedExtensions,0,deprecatedExtensions._M_string_length - 2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&deprecatedExtensions,&local_4e0.first);
    std::__cxx11::string::~string((string *)&local_4e0);
    if (previousLeave._M_string_length != 0) {
      std::operator+(&local_4e0.first,"\n",&previousLeave);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&deprecatedExtensions,&local_4e0.first);
      std::__cxx11::string::~string((string *)&local_4e0);
    }
  }
  std::__cxx11::string::~string((string *)&previousLeave);
  std::__cxx11::string::~string((string *)&previousEnter);
  deprecatedBy._M_dataplus._M_p = (pointer)&deprecatedBy.field_2;
  deprecatedBy._M_string_length = 0;
  previousEnter._M_dataplus._M_p = (pointer)&previousEnter.field_2;
  previousEnter._M_string_length = 0;
  deprecatedBy.field_2._M_local_buf[0] = '\0';
  previousEnter.field_2._M_local_buf[0] = '\0';
  previousLeave._M_dataplus._M_p = (pointer)&previousLeave.field_2;
  previousLeave._M_string_length = 0;
  previousLeave.field_2._M_local_buf[0] = '\0';
  pEVar5 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar10 = &((this->m_extensions).
              super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
              ._M_impl.super__Vector_impl_data._M_start)->name;
  while( true ) {
    pEVar1 = (pointer)((long)&psVar10[-2].field_2 + 8);
    if (pEVar1 == pEVar5) break;
    if (psVar10[-1].field_2._M_local_buf[8] == '\x01') {
      pVVar7 = this;
      getProtectFromTitle(&previousLeave_6,this,psVar10);
      generateProtection(&local_4e0,pVVar7,&previousLeave_6,true);
      std::__cxx11::string::~string((string *)&previousLeave_6);
      _Var3 = std::operator==(&previousEnter,&local_4e0.first);
      if (_Var3) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"\n",&local_928);
      }
      else {
        std::operator+(&local_5a0,"\n",&previousLeave);
        std::operator+(&local_8a0,&local_5a0,&local_4e0.first);
      }
      std::operator+(&local_900,&local_8a0,"  if ( extension == \"");
      std::operator+(&local_8e0,&local_900,psVar10);
      std::operator+(&local_920,&local_8e0,"\" ) { return \"");
      std::__cxx11::string::string
                ((string *)&local_8c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pEVar1);
      std::operator+(&local_990,&local_920,&local_8c0);
      std::operator+(&previousLeave_6,&local_990,"\"; }");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&deprecatedBy,&previousLeave_6);
      std::__cxx11::string::~string((string *)&previousLeave_6);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::~string((string *)&local_900);
      std::__cxx11::string::~string((string *)&local_8a0);
      if (!_Var3) {
        std::__cxx11::string::~string((string *)&local_5a0);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousEnter,&local_4e0.first);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousLeave,&local_4e0.second);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_4e0);
    }
    psVar10 = (string *)((long)&psVar10[0xc].field_2 + 8);
  }
  if (previousLeave._M_string_length != 0) {
    std::operator+(&local_4e0.first,"\n",&previousLeave);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&deprecatedBy,&local_4e0.first);
    std::__cxx11::string::~string((string *)&local_4e0);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&deprecatedBy,"\n  return \"\";");
  std::__cxx11::string::~string((string *)&previousLeave);
  std::__cxx11::string::~string((string *)&previousEnter);
  obsoletedBy._M_dataplus._M_p = (pointer)&obsoletedBy.field_2;
  obsoletedBy._M_string_length = 0;
  obsoletedBy.field_2._M_local_buf[0] = '\0';
  previousEnter._M_dataplus._M_p = (pointer)&previousEnter.field_2;
  previousEnter._M_string_length = 0;
  previousEnter.field_2._M_local_buf[0] = '\0';
  previousLeave._M_dataplus._M_p = (pointer)&previousLeave.field_2;
  previousLeave._M_string_length = 0;
  previousLeave.field_2._M_local_buf[0] = '\0';
  pEVar1 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar5 = (this->m_extensions).
                super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar5 != pEVar1; pEVar5 = pEVar5 + 1) {
    if ((pEVar5->obsoletedBy)._M_string_length != 0) {
      pVVar7 = this;
      getProtectFromTitle(&previousLeave_6,this,&pEVar5->name);
      generateProtection(&local_4e0,pVVar7,&previousLeave_6,true);
      std::__cxx11::string::~string((string *)&previousLeave_6);
      _Var3 = std::operator==(&previousEnter,&local_4e0.first);
      if (_Var3) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"\n",&local_927);
      }
      else {
        std::operator+(&local_580,"\n",&previousLeave);
        std::operator+(&local_8a0,&local_580,&local_4e0.first);
      }
      std::operator+(&local_900,&local_8a0,"  if ( extension == \"");
      std::operator+(&local_8e0,&local_900,&pEVar5->name);
      std::operator+(&local_920,&local_8e0,"\" ) { return \"");
      std::__cxx11::string::string((string *)&local_8c0,&pEVar5->obsoletedBy);
      std::operator+(&local_990,&local_920,&local_8c0);
      std::operator+(&previousLeave_6,&local_990,"\"; }");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&obsoletedBy,&previousLeave_6);
      std::__cxx11::string::~string((string *)&previousLeave_6);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::~string((string *)&local_900);
      std::__cxx11::string::~string((string *)&local_8a0);
      if (!_Var3) {
        std::__cxx11::string::~string((string *)&local_580);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousEnter,&local_4e0.first);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousLeave,&local_4e0.second);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_4e0);
    }
  }
  if (previousLeave._M_string_length != 0) {
    std::operator+(&local_4e0.first,"\n",&previousLeave);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&obsoletedBy,&local_4e0.first);
    std::__cxx11::string::~string((string *)&local_4e0);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&obsoletedBy,"\n  return \"\";");
  std::__cxx11::string::~string((string *)&previousLeave);
  std::__cxx11::string::~string((string *)&previousEnter);
  obsoletedExtensions._M_dataplus._M_p = (pointer)&obsoletedExtensions.field_2;
  obsoletedExtensions._M_string_length = 0;
  obsoletedExtensions.field_2._M_local_buf[0] = '\0';
  previousEnter._M_dataplus._M_p = (pointer)&previousEnter.field_2;
  previousEnter._M_string_length = 0;
  previousEnter.field_2._M_local_buf[0] = '\0';
  previousLeave._M_dataplus._M_p = (pointer)&previousLeave.field_2;
  previousLeave._M_string_length = 0;
  previousLeave.field_2._M_local_buf[0] = '\0';
  pEVar1 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar5 = (this->m_extensions).
                super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar5 != pEVar1; pEVar5 = pEVar5 + 1) {
    if ((pEVar5->obsoletedBy)._M_string_length != 0) {
      pVVar7 = this;
      getProtectFromTitle(&previousLeave_6,this,&pEVar5->name);
      generateProtection(&local_4e0,pVVar7,&previousLeave_6,true);
      std::__cxx11::string::~string((string *)&previousLeave_6);
      _Var3 = std::operator==(&previousEnter,&local_4e0.first);
      if (_Var3) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"\n",&local_926);
      }
      else {
        std::operator+(&local_560,"\n",&previousLeave);
        std::operator+(&local_8a0,&local_560,&local_4e0.first);
      }
      std::operator+(&local_900,&local_8a0,"{ \"");
      std::operator+(&local_8e0,&local_900,&pEVar5->name);
      std::operator+(&local_920,&local_8e0,"\", \"");
      std::__cxx11::string::string((string *)&local_8c0,&pEVar5->obsoletedBy);
      std::operator+(&local_990,&local_920,&local_8c0);
      std::operator+(&previousLeave_6,&local_990,"\"}, ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&obsoletedExtensions,&previousLeave_6);
      std::__cxx11::string::~string((string *)&previousLeave_6);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::~string((string *)&local_900);
      std::__cxx11::string::~string((string *)&local_8a0);
      if (!_Var3) {
        std::__cxx11::string::~string((string *)&local_560);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousEnter,&local_4e0.first);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousLeave,&local_4e0.second);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_4e0);
    }
  }
  if (obsoletedExtensions._M_string_length != 0) {
    bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            ends_with(&obsoletedExtensions,", ");
    if (!bVar4) {
      pcVar8 = 
      "std::string VulkanHppGenerator::generateReplacedExtensionsList(Predicate, Extraction) const [Predicate = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:178:76), Extraction = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:179:75)]"
      ;
      goto LAB_0010d6cf;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_4e0.first,&obsoletedExtensions,0,obsoletedExtensions._M_string_length - 2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&obsoletedExtensions,&local_4e0.first);
    std::__cxx11::string::~string((string *)&local_4e0);
    if (previousLeave._M_string_length != 0) {
      std::operator+(&local_4e0.first,"\n",&previousLeave);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&obsoletedExtensions,&local_4e0.first);
      std::__cxx11::string::~string((string *)&local_4e0);
    }
  }
  std::__cxx11::string::~string((string *)&previousLeave);
  std::__cxx11::string::~string((string *)&previousEnter);
  promotedExtensions._M_dataplus._M_p = (pointer)&promotedExtensions.field_2;
  promotedExtensions._M_string_length = 0;
  promotedExtensions.field_2._M_local_buf[0] = '\0';
  previousEnter._M_dataplus._M_p = (pointer)&previousEnter.field_2;
  previousEnter._M_string_length = 0;
  previousEnter.field_2._M_local_buf[0] = '\0';
  previousLeave._M_dataplus._M_p = (pointer)&previousLeave.field_2;
  previousLeave._M_string_length = 0;
  previousLeave.field_2._M_local_buf[0] = '\0';
  pEVar1 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar5 = (this->m_extensions).
                super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar5 != pEVar1; pEVar5 = pEVar5 + 1) {
    if ((pEVar5->promotedTo)._M_string_length != 0) {
      pVVar7 = this;
      getProtectFromTitle(&previousLeave_6,this,&pEVar5->name);
      generateProtection(&local_4e0,pVVar7,&previousLeave_6,true);
      std::__cxx11::string::~string((string *)&previousLeave_6);
      _Var3 = std::operator==(&previousEnter,&local_4e0.first);
      if (_Var3) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"\n",&local_925);
      }
      else {
        std::operator+(&local_540,"\n",&previousLeave);
        std::operator+(&local_8a0,&local_540,&local_4e0.first);
      }
      std::operator+(&local_900,&local_8a0,"{ \"");
      std::operator+(&local_8e0,&local_900,&pEVar5->name);
      std::operator+(&local_920,&local_8e0,"\", \"");
      std::__cxx11::string::string((string *)&local_8c0,&pEVar5->promotedTo);
      std::operator+(&local_990,&local_920,&local_8c0);
      std::operator+(&previousLeave_6,&local_990,"\"}, ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&promotedExtensions,&previousLeave_6);
      std::__cxx11::string::~string((string *)&previousLeave_6);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::~string((string *)&local_900);
      std::__cxx11::string::~string((string *)&local_8a0);
      if (!_Var3) {
        std::__cxx11::string::~string((string *)&local_540);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousEnter,&local_4e0.first);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousLeave,&local_4e0.second);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_4e0);
    }
  }
  if (promotedExtensions._M_string_length != 0) {
    bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            ends_with(&promotedExtensions,", ");
    if (!bVar4) {
      pcVar8 = 
      "std::string VulkanHppGenerator::generateReplacedExtensionsList(Predicate, Extraction) const [Predicate = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:180:76), Extraction = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:181:74)]"
      ;
LAB_0010d6cf:
      __assert_fail("extensionsList.ends_with( \", \" )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x28fe,pcVar8);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_4e0.first,&promotedExtensions,0,promotedExtensions._M_string_length - 2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&promotedExtensions,&local_4e0.first);
    std::__cxx11::string::~string((string *)&local_4e0);
    if (previousLeave._M_string_length != 0) {
      std::operator+(&local_4e0.first,"\n",&previousLeave);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&promotedExtensions,&local_4e0.first);
      std::__cxx11::string::~string((string *)&local_4e0);
    }
  }
  std::__cxx11::string::~string((string *)&previousLeave);
  std::__cxx11::string::~string((string *)&previousEnter);
  promotedTo._M_dataplus._M_p = (pointer)&promotedTo.field_2;
  promotedTo._M_string_length = 0;
  promotedTo.field_2._M_local_buf[0] = '\0';
  previousEnter._M_dataplus._M_p = (pointer)&previousEnter.field_2;
  previousEnter._M_string_length = 0;
  previousEnter.field_2._M_local_buf[0] = '\0';
  previousLeave._M_dataplus._M_p = (pointer)&previousLeave.field_2;
  previousLeave._M_string_length = 0;
  previousLeave.field_2._M_local_buf[0] = '\0';
  pEVar1 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar5 = (this->m_extensions).
                super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar5 != pEVar1; pEVar5 = pEVar5 + 1) {
    if ((pEVar5->promotedTo)._M_string_length != 0) {
      pVVar7 = this;
      getProtectFromTitle(&previousLeave_6,this,&pEVar5->name);
      generateProtection(&local_4e0,pVVar7,&previousLeave_6,true);
      std::__cxx11::string::~string((string *)&previousLeave_6);
      _Var3 = std::operator==(&previousEnter,&local_4e0.first);
      if (_Var3) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"\n",&local_924);
      }
      else {
        std::operator+(&local_520,"\n",&previousLeave);
        std::operator+(&local_8a0,&local_520,&local_4e0.first);
      }
      std::operator+(&local_900,&local_8a0,"  if ( extension == \"");
      std::operator+(&local_8e0,&local_900,&pEVar5->name);
      std::operator+(&local_920,&local_8e0,"\" ) { return \"");
      std::__cxx11::string::string((string *)&local_8c0,&pEVar5->promotedTo);
      std::operator+(&local_990,&local_920,&local_8c0);
      std::operator+(&previousLeave_6,&local_990,"\"; }");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&promotedTo,&previousLeave_6);
      std::__cxx11::string::~string((string *)&previousLeave_6);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::~string((string *)&local_900);
      std::__cxx11::string::~string((string *)&local_8a0);
      if (!_Var3) {
        std::__cxx11::string::~string((string *)&local_520);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousEnter,&local_4e0.first);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousLeave,&local_4e0.second);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_4e0);
    }
  }
  if (previousLeave._M_string_length != 0) {
    std::operator+(&local_4e0.first,"\n",&previousLeave);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&promotedTo,&local_4e0.first);
    std::__cxx11::string::~string((string *)&local_4e0);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&promotedTo,"\n  return \"\";");
  std::__cxx11::string::~string((string *)&previousLeave);
  std::__cxx11::string::~string((string *)&previousEnter);
  versions._M_dataplus._M_p = (pointer)&versions.field_2;
  versions._M_string_length = 0;
  versions.field_2._M_local_buf[0] = '\0';
  pFVar2 = (this->m_features).
           super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__rhs = (this->m_features).
               super__Vector_base<VulkanHppGenerator::FeatureData,_std::allocator<VulkanHppGenerator::FeatureData>_>
               ._M_impl.super__Vector_impl_data._M_start; __rhs != pFVar2; __rhs = __rhs + 1) {
    std::operator+(&previousEnter,"\"",&__rhs->name);
    std::operator+(&local_4e0.first,&previousEnter,"\", ");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&versions,&local_4e0.first);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&previousEnter);
  }
  bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::ends_with
                    (&versions,", ");
  if (!bVar4) {
    __assert_fail("versions.ends_with( \", \" )",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                  ,0xbe,"void VulkanHppGenerator::generateExtensionInspectionFile() const");
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_4e0.first,&versions,0,versions._M_string_length - 2);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&versions,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_4e0,(char (*) [4])0x1dae69,&this->m_api);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[21],_true>
            (&local_4a0,(char (*) [21])"deprecatedExtensions",&deprecatedExtensions);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_640,"device",&local_92a);
  generateExtensionsList(&local_620,this,&local_640);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_460,(char (*) [17])"deviceExtensions",&local_620);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_680,"device",&local_92b);
  generateExtensionTypeTest(&local_660,this,&local_680);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[11],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_420,(char (*) [11])"deviceTest",&local_660);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[13],_true>(&local_3e0,(char (*) [13])"deprecatedBy",&deprecatedBy);
  local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
  local_7e0._M_string_length = 0;
  previousLeave._M_dataplus._M_p = (pointer)&previousLeave.field_2;
  previousLeave._M_string_length = 0;
  local_7e0.field_2._M_local_buf[0] = '\0';
  previousLeave.field_2._M_local_buf[0] = '\0';
  previousLeave_6._M_dataplus._M_p = (pointer)&previousLeave_6.field_2;
  previousLeave_6._M_string_length = 0;
  previousLeave_6.field_2._M_local_buf[0] = '\0';
  pEVar1 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar5 = (this->m_extensions).
                super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar5 != pEVar1; pEVar5 = pEVar5 + 1) {
    if (pEVar5->isDeprecated == true) {
      pVVar7 = this;
      getProtectFromTitle(&local_990,this,&pEVar5->name);
      generateProtection((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&previousEnter,pVVar7,&local_990,true);
      std::__cxx11::string::~string((string *)&local_990);
      _Var3 = std::operator==(&previousLeave,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &previousEnter);
      if (_Var3) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"\n",&local_923);
      }
      else {
        std::operator+(&local_500,"\n",&previousLeave_6);
        std::operator+(&local_900,&local_500,&previousEnter);
      }
      std::operator+(&local_8e0,&local_900,"( extension == \"");
      std::operator+(&local_920,&local_8e0,&pEVar5->name);
      std::operator+(&local_990,&local_920,"\" ) || ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_7e0,&local_990);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::~string((string *)&local_900);
      if (!_Var3) {
        std::__cxx11::string::~string((string *)&local_500);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousLeave,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&previousEnter
                );
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousLeave_6,&local_950);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&previousEnter);
    }
  }
  if (previousLeave_6._M_string_length == 0) {
    bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            ends_with(&local_7e0," || ");
    if (!bVar4) {
      pcVar8 = 
      "std::string VulkanHppGenerator::generateExtensionReplacedTest(Predicate) const [Predicate = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:200:74)]"
      ;
      goto LAB_0010d71c;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&previousEnter,&local_7e0,0,local_7e0._M_string_length - 4);
    pbVar9 = &previousEnter;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_7e0,pbVar9);
  }
  else {
    std::operator+(&local_990,"\n",&previousLeave_6);
    std::operator+(&previousEnter,&local_990,"false");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_7e0,&previousEnter);
    std::__cxx11::string::~string((string *)&previousEnter);
    pbVar9 = &local_990;
  }
  std::__cxx11::string::~string((string *)pbVar9);
  std::__cxx11::string::~string((string *)&previousLeave_6);
  std::__cxx11::string::~string((string *)&previousLeave);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_3a0,(char (*) [15])"deprecatedTest",&local_7e0);
  generateExtensionDependencies_abi_cxx11_(&local_6a0,this);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[22],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_360,(char (*) [22])"extensionDependencies",&local_6a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e0,"instance",&local_92c);
  generateExtensionsList(&local_6c0,this,&local_6e0);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[19],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_320,(char (*) [19])"instanceExtensions",&local_6c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_720,"instance",&local_92d);
  generateExtensionTypeTest(&local_700,this,&local_720);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_2e0,(char (*) [13])"instanceTest",&local_700);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_true>
            (&local_2a0,(char (*) [14])"licenseHeader",&this->m_vulkanLicenseHeader);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[12],_true>(&local_260,(char (*) [12])"obsoletedBy",&obsoletedBy);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_true>
            (&local_220,(char (*) [20])"obsoletedExtensions",&obsoletedExtensions);
  local_800._M_dataplus._M_p = (pointer)&local_800.field_2;
  local_800._M_string_length = 0;
  previousLeave._M_dataplus._M_p = (pointer)&previousLeave.field_2;
  previousLeave._M_string_length = 0;
  local_800.field_2._M_local_buf[0] = '\0';
  previousLeave.field_2._M_local_buf[0] = '\0';
  previousLeave_6._M_dataplus._M_p = (pointer)&previousLeave_6.field_2;
  previousLeave_6._M_string_length = 0;
  previousLeave_6.field_2._M_local_buf[0] = '\0';
  pEVar1 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar5 = (this->m_extensions).
                super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar5 != pEVar1; pEVar5 = pEVar5 + 1) {
    if ((pEVar5->obsoletedBy)._M_string_length != 0) {
      pVVar7 = this;
      getProtectFromTitle(&local_990,this,&pEVar5->name);
      generateProtection((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&previousEnter,pVVar7,&local_990,true);
      std::__cxx11::string::~string((string *)&local_990);
      _Var3 = std::operator==(&previousLeave,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &previousEnter);
      if (_Var3) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"\n",&local_922);
      }
      else {
        std::operator+(&local_8c0,"\n",&previousLeave_6);
        std::operator+(&local_900,&local_8c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &previousEnter);
      }
      std::operator+(&local_8e0,&local_900,"( extension == \"");
      std::operator+(&local_920,&local_8e0,&pEVar5->name);
      std::operator+(&local_990,&local_920,"\" ) || ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_800,&local_990);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::~string((string *)&local_900);
      if (!_Var3) {
        std::__cxx11::string::~string((string *)&local_8c0);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousLeave,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&previousEnter
                );
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousLeave_6,&local_950);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&previousEnter);
    }
  }
  if (previousLeave_6._M_string_length == 0) {
    bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            ends_with(&local_800," || ");
    if (!bVar4) {
      pcVar8 = 
      "std::string VulkanHppGenerator::generateExtensionReplacedTest(Predicate) const [Predicate = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:207:73)]"
      ;
      goto LAB_0010d71c;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&previousEnter,&local_800,0,local_800._M_string_length - 4);
    pbVar9 = &previousEnter;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_800,pbVar9);
  }
  else {
    std::operator+(&local_990,"\n",&previousLeave_6);
    std::operator+(&previousEnter,&local_990,"false");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_800,&previousEnter);
    std::__cxx11::string::~string((string *)&previousEnter);
    pbVar9 = &local_990;
  }
  std::__cxx11::string::~string((string *)pbVar9);
  std::__cxx11::string::~string((string *)&previousLeave_6);
  std::__cxx11::string::~string((string *)&previousLeave);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[14],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_1e0,(char (*) [14])"obsoletedTest",&local_800);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[19],_true>
            (&local_1a0,(char (*) [19])"promotedExtensions",&promotedExtensions);
  local_820._M_dataplus._M_p = (pointer)&local_820.field_2;
  local_820._M_string_length = 0;
  previousLeave._M_dataplus._M_p = (pointer)&previousLeave.field_2;
  previousLeave._M_string_length = 0;
  local_820.field_2._M_local_buf[0] = '\0';
  previousLeave.field_2._M_local_buf[0] = '\0';
  previousLeave_6._M_dataplus._M_p = (pointer)&previousLeave_6.field_2;
  previousLeave_6._M_string_length = 0;
  previousLeave_6.field_2._M_local_buf[0] = '\0';
  pEVar1 = (this->m_extensions).
           super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar5 = (this->m_extensions).
                super__Vector_base<VulkanHppGenerator::ExtensionData,_std::allocator<VulkanHppGenerator::ExtensionData>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar5 != pEVar1; pEVar5 = pEVar5 + 1) {
    if ((pEVar5->promotedTo)._M_string_length != 0) {
      pVVar7 = this;
      getProtectFromTitle(&local_990,this,&pEVar5->name);
      generateProtection((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&previousEnter,pVVar7,&local_990,true);
      std::__cxx11::string::~string((string *)&local_990);
      _Var3 = std::operator==(&previousLeave,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &previousEnter);
      if (_Var3) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_900,"\n",&local_921);
      }
      else {
        std::operator+(&local_8a0,"\n",&previousLeave_6);
        std::operator+(&local_900,&local_8a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &previousEnter);
      }
      std::operator+(&local_8e0,&local_900,"( extension == \"");
      std::operator+(&local_920,&local_8e0,&pEVar5->name);
      std::operator+(&local_990,&local_920,"\" ) || ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_820,&local_990);
      std::__cxx11::string::~string((string *)&local_990);
      std::__cxx11::string::~string((string *)&local_920);
      std::__cxx11::string::~string((string *)&local_8e0);
      std::__cxx11::string::~string((string *)&local_900);
      if (!_Var3) {
        std::__cxx11::string::~string((string *)&local_8a0);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousLeave,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&previousEnter
                );
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&previousLeave_6,&local_950);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&previousEnter);
    }
  }
  if (previousLeave_6._M_string_length == 0) {
    bVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            ends_with(&local_820," || ");
    if (!bVar4) {
      pcVar8 = 
      "std::string VulkanHppGenerator::generateExtensionReplacedTest(Predicate) const [Predicate = (lambda at /workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp:209:72)]"
      ;
LAB_0010d71c:
      __assert_fail("replacedTest.ends_with( \" || \" )",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x1dac,pcVar8);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&previousEnter,&local_820,0,local_820._M_string_length - 4);
    pbVar9 = &previousEnter;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_820,pbVar9);
  }
  else {
    std::operator+(&local_990,"\n",&previousLeave_6);
    std::operator+(&previousEnter,&local_990,"false");
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_820,&previousEnter);
    std::__cxx11::string::~string((string *)&previousEnter);
    pbVar9 = &local_990;
  }
  std::__cxx11::string::~string((string *)pbVar9);
  std::__cxx11::string::~string((string *)&previousLeave_6);
  std::__cxx11::string::~string((string *)&previousLeave);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[13],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_160,(char (*) [13])"promotedTest",&local_820);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[11],_true>(&local_120,(char (*) [11])"promotedTo",&promotedTo);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_e0,(char (*) [9])"versions",&versions);
  bVar4 = std::operator==(&this->m_api,"vulkan");
  pcVar8 = "(void)extension;";
  if (bVar4) {
    pcVar8 = "";
  }
  previousEnter._M_dataplus._M_p = pcVar8;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_const_char_*,_true>
            (&local_a0,(char (*) [14])"voidExtension",(char **)&previousEnter);
  __l._M_len = 0x12;
  __l._M_array = (iterator)&local_4e0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_60,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &previousLeave,(allocator_type *)&previousLeave_6);
  replaceWithMap(&str,&vulkanExtensionInspectionHppTemplate,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_60);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  lVar6 = 0x440;
  do {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&local_4e0.first._M_dataplus._M_p + lVar6));
    lVar6 = lVar6 + -0x40;
  } while (lVar6 != -0x40);
  std::__cxx11::string::~string((string *)&local_820);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::string::~string((string *)&local_720);
  std::__cxx11::string::~string((string *)&local_6c0);
  std::__cxx11::string::~string((string *)&local_6e0);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::__cxx11::string::~string((string *)&local_660);
  std::__cxx11::string::~string((string *)&local_680);
  std::__cxx11::string::~string((string *)&local_620);
  std::__cxx11::string::~string((string *)&local_640);
  writeToFile(&str,&vulkan_extension_inspection_hpp);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::~string((string *)&versions);
  std::__cxx11::string::~string((string *)&promotedTo);
  std::__cxx11::string::~string((string *)&promotedExtensions);
  std::__cxx11::string::~string((string *)&obsoletedExtensions);
  std::__cxx11::string::~string((string *)&obsoletedBy);
  std::__cxx11::string::~string((string *)&deprecatedBy);
  std::__cxx11::string::~string((string *)&deprecatedExtensions);
  std::__cxx11::string::~string((string *)&vulkanExtensionInspectionHppTemplate);
  std::__cxx11::string::~string((string *)&vulkan_extension_inspection_hpp);
  return;
}

Assistant:

void VulkanHppGenerator::generateExtensionInspectionFile() const
{
  std::string const vulkan_extension_inspection_hpp = std::string( BASE_PATH ) + "/vulkan/" + m_api + "_extension_inspection.hpp";
  messager.message( "VulkanHppGenerator: Generating " + vulkan_extension_inspection_hpp + " ...\n" );

  std::string const vulkanExtensionInspectionHppTemplate = readSnippet( "ExtensionInspection.hpp" );
  std::string const deprecatedExtensions = generateReplacedExtensionsList( []( ExtensionData const & extension ) { return extension.isDeprecated; },
                                                                           []( ExtensionData const & extension ) { return extension.deprecatedBy; } );
  std::string const deprecatedBy         = generateExtensionReplacedBy( []( ExtensionData const & extension ) { return extension.isDeprecated; },
                                                                []( ExtensionData const & extension ) { return extension.deprecatedBy; } );
  std::string const obsoletedBy          = generateExtensionReplacedBy( []( ExtensionData const & extension ) { return !extension.obsoletedBy.empty(); },
                                                               []( ExtensionData const & extension ) { return extension.obsoletedBy; } );
  std::string const obsoletedExtensions  = generateReplacedExtensionsList( []( ExtensionData const & extension ) { return !extension.obsoletedBy.empty(); },
                                                                          []( ExtensionData const & extension ) { return extension.obsoletedBy; } );
  std::string const promotedExtensions   = generateReplacedExtensionsList( []( ExtensionData const & extension ) { return !extension.promotedTo.empty(); },
                                                                         []( ExtensionData const & extension ) { return extension.promotedTo; } );
  std::string const promotedTo           = generateExtensionReplacedBy( []( ExtensionData const & extension ) { return !extension.promotedTo.empty(); },
                                                              []( ExtensionData const & extension ) { return extension.promotedTo; } );

  std::string versions;
  for ( auto const & feature : m_features )
  {
    versions += "\"" + feature.name + "\", ";
  }
  assert( versions.ends_with( ", " ) );
  versions = versions.substr( 0, versions.length() - 2 );

  std::string str =
    replaceWithMap( vulkanExtensionInspectionHppTemplate,
                    { { "api", m_api },
                      { "deprecatedExtensions", deprecatedExtensions },
                      { "deviceExtensions", generateExtensionsList( "device" ) },
                      { "deviceTest", generateExtensionTypeTest( "device" ) },
                      { "deprecatedBy", deprecatedBy },
                      { "deprecatedTest", generateExtensionReplacedTest( []( ExtensionData const & extension ) { return extension.isDeprecated; } ) },
                      { "extensionDependencies", generateExtensionDependencies() },
                      { "instanceExtensions", generateExtensionsList( "instance" ) },
                      { "instanceTest", generateExtensionTypeTest( "instance" ) },
                      { "licenseHeader", m_vulkanLicenseHeader },
                      { "obsoletedBy", obsoletedBy },
                      { "obsoletedExtensions", obsoletedExtensions },
                      { "obsoletedTest", generateExtensionReplacedTest( []( ExtensionData const & extension ) { return !extension.obsoletedBy.empty(); } ) },
                      { "promotedExtensions", promotedExtensions },
                      { "promotedTest", generateExtensionReplacedTest( []( ExtensionData const & extension ) { return !extension.promotedTo.empty(); } ) },
                      { "promotedTo", promotedTo },
                      { "versions", versions },
                      { "voidExtension", ( m_api == "vulkan" ) ? "" : "(void)extension;" } } );

  writeToFile( str, vulkan_extension_inspection_hpp );
}